

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

void __thiscall Fl_Tree_Item::Fl_Tree_Item(Fl_Tree_Item *this,Fl_Tree_Item *o)

{
  Fl_Font FVar1;
  Fl_Fontsize FVar2;
  Fl_Color FVar3;
  char *pcVar4;
  Fl_Widget *pFVar5;
  Fl_Image *pFVar6;
  void *pvVar7;
  char *local_50;
  Fl_Tree_Item *o_local;
  Fl_Tree_Item *this_local;
  
  Fl_Tree_Item_Array::Fl_Tree_Item_Array(&this->_children,10);
  pcVar4 = label(o);
  if (pcVar4 == (char *)0x0) {
    local_50 = (char *)0x0;
  }
  else {
    pcVar4 = label(o);
    local_50 = strdup(pcVar4);
  }
  this->_label = local_50;
  FVar1 = labelfont(o);
  this->_labelfont = FVar1;
  FVar2 = labelsize(o);
  this->_labelsize = FVar2;
  FVar3 = labelfgcolor(o);
  this->_labelfgcolor = FVar3;
  FVar3 = labelbgcolor(o);
  this->_labelbgcolor = FVar3;
  pFVar5 = widget(o);
  this->_widget = pFVar5;
  this->_open = o->_open;
  this->_visible = o->_visible;
  this->_active = o->_active;
  this->_selected = o->_selected;
  this->_xywh[0] = o->_xywh[0];
  this->_xywh[1] = o->_xywh[1];
  this->_xywh[2] = o->_xywh[2];
  this->_xywh[3] = o->_xywh[3];
  this->_collapse_xywh[0] = o->_collapse_xywh[0];
  this->_collapse_xywh[1] = o->_collapse_xywh[1];
  this->_collapse_xywh[2] = o->_collapse_xywh[2];
  this->_collapse_xywh[3] = o->_collapse_xywh[3];
  this->_label_xywh[0] = o->_label_xywh[0];
  this->_label_xywh[1] = o->_label_xywh[1];
  this->_label_xywh[2] = o->_label_xywh[2];
  this->_label_xywh[3] = o->_label_xywh[3];
  pFVar6 = usericon(o);
  this->_usericon = pFVar6;
  pvVar7 = user_data(o);
  this->_userdata = pvVar7;
  this->_parent = o->_parent;
  return;
}

Assistant:

Fl_Tree_Item::Fl_Tree_Item(const Fl_Tree_Item *o) {
#if FLTK_ABI_VERSION >= 10303
  _tree             = o->_tree;
#endif
  _label        = o->label() ? strdup(o->label()) : 0;
  _labelfont    = o->labelfont();
  _labelsize    = o->labelsize();
  _labelfgcolor = o->labelfgcolor();
  _labelbgcolor = o->labelbgcolor();
  _widget       = o->widget();
#if FLTK_ABI_VERSION >= 10301
  _flags        = o->_flags;
#else /*FLTK_ABI_VERSION*/
  _open         = o->_open;
  _visible      = o->_visible;
  _active       = o->_active;
  _selected     = o->_selected;
#endif /*FLTK_ABI_VERSION*/
  _xywh[0]      = o->_xywh[0];
  _xywh[1]      = o->_xywh[1];
  _xywh[2]      = o->_xywh[2];
  _xywh[3]      = o->_xywh[3];
  _collapse_xywh[0] = o->_collapse_xywh[0];
  _collapse_xywh[1] = o->_collapse_xywh[1];
  _collapse_xywh[2] = o->_collapse_xywh[2];
  _collapse_xywh[3] = o->_collapse_xywh[3];
  _label_xywh[0]    = o->_label_xywh[0];
  _label_xywh[1]    = o->_label_xywh[1];
  _label_xywh[2]    = o->_label_xywh[2];
  _label_xywh[3]    = o->_label_xywh[3];
  _usericon         = o->usericon();
  _userdata         = o->user_data();
  _parent           = o->_parent;
#if FLTK_ABI_VERSION >= 10301
  _prev_sibling     = 0;		// do not copy ptrs! use update_prev_next()
  _next_sibling     = 0;		// do not copy ptrs! use update_prev_next()
#endif /*FLTK_ABI_VERSION*/
}